

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O3

int testSimpleNNShape(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<float> *this;
  Rep *pRVar2;
  ulong uVar3;
  bool bVar4;
  FeatureType *pFVar5;
  long *plVar6;
  FeatureDescription *pFVar7;
  ArrayFeatureType *pAVar8;
  NeuralNetworkLayer *pNVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  void *pvVar11;
  LayerUnion LVar12;
  WeightParams *pWVar13;
  float *pfVar14;
  ostream *poVar15;
  undefined8 *puVar16;
  uint uVar17;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar18;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Arena *pAVar19;
  int iVar20;
  Model m1;
  Result res;
  NeuralNetworkShaper shapes;
  Model MStack_e8;
  Result local_b8;
  NeuralNetworkShaper local_90;
  
  CoreML::Specification::Model::Model(&MStack_e8,(Arena *)0x0,false);
  if (MStack_e8.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(MStack_e8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_e8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    MStack_e8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar2 = ((MStack_e8.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0014ccee:
    pRVar18 = &(MStack_e8.description_)->input_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar20 = ((MStack_e8.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar20) goto LAB_0014ccee;
    ((MStack_e8.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar11 = pRVar2->elements[iVar20];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"input",puVar16);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  uVar17 = (pAVar8->shape_).current_size_;
  if (uVar17 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar17 + 1);
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar17] = 4;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar17] = 4;
  }
  pRVar1->current_size_ = uVar17 + 1;
  if (MStack_e8.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(MStack_e8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_e8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    MStack_e8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar2 = ((MStack_e8.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0014ce19:
    pRVar18 = &(MStack_e8.description_)->output_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar20 = ((MStack_e8.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar20) goto LAB_0014ce19;
    ((MStack_e8.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar11 = pRVar2->elements[iVar20];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"output",puVar16);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  uVar17 = (pAVar8->shape_).current_size_;
  if (uVar17 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar17 + 1);
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar17] = 3;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar17] = 3;
  }
  pRVar1->current_size_ = uVar17 + 1;
  if (MStack_e8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_e8);
    MStack_e8._oneof_case_[0] = 500;
    pAVar19 = (Arena *)(MStack_e8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_e8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    MStack_e8.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar19);
  }
  pRVar2 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_e8.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0014cf5b:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_e8.Type_.pipeline_)->models_;
    pNVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                       ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar9 = (NeuralNetworkLayer *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       ((RepeatedPtrFieldBase *)this_00,pNVar9);
  }
  else {
    iVar20 = (MStack_e8.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar2->allocated_size <= iVar20) goto LAB_0014cf5b;
    (MStack_e8.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar20 + 1;
    pNVar9 = (NeuralNetworkLayer *)pRVar2->elements[iVar20];
  }
  pRVar2 = (pNVar9->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0014cf93:
    pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar9->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar9->input_).super_RepeatedPtrFieldBase,pbVar10);
  }
  else {
    iVar20 = (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar20) goto LAB_0014cf93;
    (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar11 = pRVar2->elements[iVar20];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3a8ef3);
  pRVar2 = (pNVar9->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar20 = (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar20 < pRVar2->allocated_size) {
      (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
      pvVar11 = pRVar2->elements[iVar20];
      goto LAB_0014cffd;
    }
  }
  pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar9->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar9->output_).super_RepeatedPtrFieldBase,pbVar10);
LAB_0014cffd:
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3bbdaf);
  if (pNVar9->_oneof_case_[0] == 0x8c) {
    LVar12 = pNVar9->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar9);
    pNVar9->_oneof_case_[0] = 0x8c;
    uVar3 = (pNVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    LVar12.innerproduct_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>
                   (pAVar19);
    (pNVar9->layer_).innerproduct_ = (InnerProductLayerParams *)LVar12;
  }
  (LVar12.innerproduct_)->inputchannels_ = 4;
  (LVar12.innerproduct_)->outputchannels_ = 3;
  iVar20 = 0xc;
  do {
    pWVar13 = (WeightParams *)((LVar12.activation_)->NonlinearityType_).relu_;
    if (pWVar13 == (WeightParams *)0x0) {
      uVar3 = ((LVar12.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pWVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar19);
      ((LVar12.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar13;
    }
    this = &pWVar13->floatvalue_;
    uVar17 = (pWVar13->floatvalue_).current_size_;
    if (uVar17 == (pWVar13->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(this,uVar17 + 1);
      pfVar14 = google::protobuf::RepeatedField<float>::elements(this);
      pfVar14[uVar17] = 1.0;
    }
    else {
      pfVar14 = google::protobuf::RepeatedField<float>::elements(this);
      pfVar14[uVar17] = 1.0;
    }
    this->current_size_ = uVar17 + 1;
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  (LVar12.innerproduct_)->hasbias_ = false;
  CoreML::validate<(MLModelType)500>(&local_b8,&MStack_e8);
  bVar4 = CoreML::Result::good(&local_b8);
  if (bVar4) {
    CoreML::NeuralNetworkShaper::NeuralNetworkShaper(&local_90,&MStack_e8,true);
    bVar4 = CoreML::NeuralNetworkShaper::isValid(&local_90);
    if (!bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                 ,100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x33);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"shapes.isValid()",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
    }
    uVar17 = (uint)!bVar4;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
    ::~_Rb_tree(&local_90.blobShapes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_90.blobColors._M_t);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    uVar17 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_message._M_dataplus._M_p != &local_b8.m_message.field_2) {
    operator_delete(local_b8.m_message._M_dataplus._M_p,
                    local_b8.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_e8);
  return uVar17;
}

Assistant:

int testSimpleNNShape() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(4);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(4);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 12; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    NeuralNetworkShaper shapes = NeuralNetworkShaper(m1);

    ML_ASSERT(shapes.isValid());

    return 0;

}